

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_modf(lua_State *L)

{
  int iVar1;
  lua_Number __x;
  undefined8 local_38;
  undefined8 local_28;
  lua_Number ip;
  lua_Number n;
  lua_State *L_local;
  
  iVar1 = lua_isinteger(L,1);
  if (iVar1 == 0) {
    __x = luaL_checknumber(L,1);
    if (0.0 <= __x) {
      local_28 = floor(__x);
    }
    else {
      local_28 = ceil(__x);
    }
    pushnumint(L,local_28);
    if ((__x != local_28) || (NAN(__x) || NAN(local_28))) {
      local_38 = __x - local_28;
    }
    else {
      local_38 = 0.0;
    }
    lua_pushnumber(L,local_38);
  }
  else {
    lua_settop(L,1);
    lua_pushnumber(L,0.0);
  }
  return 2;
}

Assistant:

static int math_modf(lua_State *L) {
    if (lua_isinteger(L, 1)) {
        lua_settop(L, 1);  /* number is its own integer part */
        lua_pushnumber(L, 0);  /* no fractional part */
    } else {
        lua_Number n = luaL_checknumber(L, 1);
        /* integer part (rounds toward zero) */
        lua_Number ip = (n < 0) ? l_mathop(ceil)(n) : l_mathop(floor)(n);
        pushnumint(L, ip);
        /* fractional part (test needed for inf/-inf) */
        lua_pushnumber(L, (n == ip) ? l_mathop(0.0) : (n - ip));
    }
    return 2;
}